

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ft_font_renderer.cpp
# Opt level: O0

void __thiscall FtFontRenderer::FtFontRenderer(FtFontRenderer *this,FontRendererArgs *args)

{
  FontRendererError *pFVar1;
  undefined8 uVar2;
  string local_90 [39];
  undefined1 local_69;
  undefined1 local_68 [32];
  string local_48 [32];
  int local_28;
  FT_Error err;
  FontRendererArgs *local_18;
  FontRendererArgs *args_local;
  FtFontRenderer *this_local;
  
  local_18 = args;
  args_local = (FontRendererArgs *)this;
  dpfb::FontRenderer::FontRenderer(&this->super_FontRenderer);
  (this->super_FontRenderer)._vptr_FontRenderer = (_func_int **)&PTR__FtFontRenderer_00166838;
  refLib();
  local_28 = FT_New_Memory_Face(library,local_18->data,local_18->dataSize,0,&this->face);
  if (local_28 != 0) {
    unrefLib();
    local_69 = 1;
    pFVar1 = (FontRendererError *)__cxa_allocate_exception(0x10);
    ftErrorToStr_abi_cxx11_((FT_Error)local_68);
    uVar2 = std::__cxx11::string::c_str();
    dpfb::str::format_abi_cxx11_((char *)local_48,"Can\'t open font: %s",uVar2);
    dpfb::FontRendererError::runtime_error(pFVar1,local_48);
    local_69 = 0;
    __cxa_throw(pFVar1,&dpfb::FontRendererError::typeinfo,
                dpfb::FontRendererError::~FontRendererError);
  }
  if (this->face->charmap == (FT_CharMap)0x0) {
    FT_Done_Face(this->face);
    unrefLib();
    pFVar1 = (FontRendererError *)__cxa_allocate_exception(0x10);
    dpfb::FontRendererError::runtime_error(pFVar1,"Font doesn\'t contain Unicode charmap");
    __cxa_throw(pFVar1,&dpfb::FontRendererError::typeinfo,
                dpfb::FontRendererError::~FontRendererError);
  }
  local_28 = FT_Set_Char_Size(this->face,(long)(local_18->pxSize << 6),0,0x48);
  if (local_28 != 0) {
    FT_Done_Face(this->face);
    unrefLib();
    pFVar1 = (FontRendererError *)__cxa_allocate_exception(0x10);
    ftErrorToStr_abi_cxx11_((FT_Error)local_90);
    dpfb::FontRendererError::runtime_error(pFVar1,local_90);
    __cxa_throw(pFVar1,&dpfb::FontRendererError::typeinfo,
                dpfb::FontRendererError::~FontRendererError);
  }
  this->loadFlags = 0;
  if (local_18->hinting == light) {
    this->loadFlags = this->loadFlags | 0x10000;
  }
  return;
}

Assistant:

FtFontRenderer::FtFontRenderer(const dpfb::FontRendererArgs& args)
{
    refLib();

    auto err = FT_New_Memory_Face(
        library, args.data, args.dataSize, 0, &face);
    if (err != FT_Err_Ok) {
        unrefLib();
        throw dpfb::FontRendererError(
            dpfb::str::format(
                "Can't open font: %s", ftErrorToStr(err).c_str()));
    }

    if (!face->charmap) {
        FT_Done_Face(face);
        unrefLib();
        throw dpfb::FontRendererError(
            "Font doesn't contain Unicode charmap");
    }

    err = FT_Set_Char_Size(face, args.pxSize * 64, 0, 72, 0);
    if (err != FT_Err_Ok) {
        FT_Done_Face(face);
        unrefLib();
        throw dpfb::FontRendererError(ftErrorToStr(err));
    }

    loadFlags = FT_LOAD_DEFAULT;
    if (args.hinting == dpfb::Hinting::light)
        loadFlags |= FT_LOAD_TARGET_LIGHT;
}